

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicAtomicCase3::Run(BasicAtomicCase3 *this)

{
  bool bVar1;
  GLuint GVar2;
  int *piVar3;
  undefined8 *puVar4;
  uint local_160;
  uint local_15c;
  GLint i;
  GLuint u;
  float data [8];
  undefined8 local_12c;
  Vector<int,_4> local_124;
  int local_114;
  void *pvStack_110;
  int i_1;
  ivec4 *ptr;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  char *local_30;
  char *glsl_fs;
  char *glsl_gs;
  char *glsl_vs;
  BasicAtomicCase3_conflict *this_local;
  
  glsl_vs = (char *)this;
  bVar1 = ShaderStorageBufferObjectBase::SupportedInVS((ShaderStorageBufferObjectBase *)this,1);
  if (bVar1) {
    bVar1 = ShaderStorageBufferObjectBase::SupportedInGS((ShaderStorageBufferObjectBase *)this,1);
    if (bVar1) {
      glsl_gs = 
      "\nlayout(location = 0) in vec4 g_in_position;\nlayout(std430, binding = 0) buffer Buffer {\n  uvec4 u[4];\n  ivec3 i[4];\n} g_vs_buffer;\nvoid main() {\n  gl_Position = g_in_position;\n  atomicAdd(g_vs_buffer.u[0].x, g_vs_buffer.u[gl_VertexID][1]);\n  atomicAdd(g_vs_buffer.u[0][0], g_vs_buffer.u[gl_VertexID].z);\n  atomicAdd(g_vs_buffer.i[0].x, g_vs_buffer.i[gl_VertexID][1]);\n  atomicAdd(g_vs_buffer.i[0][0], g_vs_buffer.i[gl_VertexID].z);\n}"
      ;
      glsl_fs = 
      "\nlayout(points) in;\nlayout(points, max_vertices = 1) out;\nlayout(std430, binding = 0) buffer Buffer {\n  uvec4 u[4];\n  ivec3 i[4];\n} g_gs_buffer;\nvoid main() {\n  gl_Position = gl_in[0].gl_Position;\n  gl_PrimitiveID = gl_PrimitiveIDIn;\n  EmitVertex();\n  atomicAdd(g_gs_buffer.u[0].x, g_gs_buffer.u[gl_PrimitiveIDIn][1]);\n  atomicAdd(g_gs_buffer.i[0].x, g_gs_buffer.i[gl_PrimitiveIDIn][1]);\n}"
      ;
      local_30 = 
      "\nlayout(location = 0) out vec4 g_fs_out;\nlayout(std430, binding = 0) buffer Buffer {\n  uvec4 u[4];\n  ivec3 i[4];\n} g_fs_buffer;\nvoid main() {\n  g_fs_out = vec4(0, 1, 0, 1);\n  atomicAdd(g_fs_buffer.u[0].x, g_fs_buffer.u[gl_PrimitiveID][1]);\n  atomicAdd(g_fs_buffer.i[0].x, g_fs_buffer.i[gl_PrimitiveID][1]);\n}"
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,
                 "\nlayout(location = 0) in vec4 g_in_position;\nlayout(std430, binding = 0) buffer Buffer {\n  uvec4 u[4];\n  ivec3 i[4];\n} g_vs_buffer;\nvoid main() {\n  gl_Position = g_in_position;\n  atomicAdd(g_vs_buffer.u[0].x, g_vs_buffer.u[gl_VertexID][1]);\n  atomicAdd(g_vs_buffer.u[0][0], g_vs_buffer.u[gl_VertexID].z);\n  atomicAdd(g_vs_buffer.i[0].x, g_vs_buffer.i[gl_VertexID][1]);\n  atomicAdd(g_vs_buffer.i[0][0], g_vs_buffer.i[gl_VertexID].z);\n}"
                 ,&local_51);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_89);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"",&local_b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,
                 "\nlayout(points) in;\nlayout(points, max_vertices = 1) out;\nlayout(std430, binding = 0) buffer Buffer {\n  uvec4 u[4];\n  ivec3 i[4];\n} g_gs_buffer;\nvoid main() {\n  gl_Position = gl_in[0].gl_Position;\n  gl_PrimitiveID = gl_PrimitiveIDIn;\n  EmitVertex();\n  atomicAdd(g_gs_buffer.u[0].x, g_gs_buffer.u[gl_PrimitiveIDIn][1]);\n  atomicAdd(g_gs_buffer.i[0].x, g_gs_buffer.i[gl_PrimitiveIDIn][1]);\n}"
                 ,&local_d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,
                 "\nlayout(location = 0) out vec4 g_fs_out;\nlayout(std430, binding = 0) buffer Buffer {\n  uvec4 u[4];\n  ivec3 i[4];\n} g_fs_buffer;\nvoid main() {\n  g_fs_out = vec4(0, 1, 0, 1);\n  atomicAdd(g_fs_buffer.u[0].x, g_fs_buffer.u[gl_PrimitiveID][1]);\n  atomicAdd(g_fs_buffer.i[0].x, g_fs_buffer.i[gl_PrimitiveID][1]);\n}"
                 ,(allocator<char> *)((long)&ptr + 7));
      GVar2 = ShaderStorageBufferObjectBase::CreateProgram
                        ((ShaderStorageBufferObjectBase *)this,&local_50,&local_88,&local_b0,
                         &local_d8,&local_100);
      *(GLuint *)&(this->super_ComputeShaderBase).renderTarget = GVar2;
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator((allocator<char> *)((long)&ptr + 7));
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator(&local_d9);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator(&local_b1);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator(&local_89);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
      glu::CallLogWrapper::glLinkProgram
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,*(GLuint *)&(this->super_ComputeShaderBase).renderTarget);
      bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                        ((ShaderStorageBufferObjectBase *)this,
                         *(GLuint *)&(this->super_ComputeShaderBase).renderTarget);
      if (bVar1) {
        glu::CallLogWrapper::glGenBuffers
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,
                   (GLuint *)((long)&(this->super_ComputeShaderBase).renderTarget + 4));
        glu::CallLogWrapper::glBindBufferBase
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,0,
                   *(GLuint *)((long)&(this->super_ComputeShaderBase).renderTarget + 4));
        glu::CallLogWrapper::glBufferData
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,0x80,(void *)0x0,0x88e8);
        pvStack_110 = glu::CallLogWrapper::glMapBuffer
                                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                                  super_CallLogWrapper,0x90d2,0x88b9);
        if (pvStack_110 == (void *)0x0) {
          this_local = (BasicAtomicCase3_conflict *)&DAT_ffffffffffffffff;
        }
        else {
          for (local_114 = 0; local_114 < 4; local_114 = local_114 + 1) {
            tcu::Vector<int,_4>::Vector(&local_124,0,1,2,0);
            piVar3 = (int *)((long)pvStack_110 + (long)(local_114 << 1) * 0x10);
            *(undefined8 *)piVar3 = local_124.m_data._0_8_;
            *(undefined8 *)(piVar3 + 2) = local_124.m_data._8_8_;
            tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(data + 7),0,1,2,0);
            puVar4 = (undefined8 *)((long)pvStack_110 + (long)(local_114 * 2 + 1) * 0x10);
            *puVar4 = stack0xfffffffffffffecc;
            puVar4[1] = local_12c;
          }
          glu::CallLogWrapper::glUnmapBuffer
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x90d2);
          _i = 0xbf4ccccdbf4ccccd;
          data[0] = 0.8;
          data[1] = -0.8;
          data[2] = -0.8;
          data[3] = 0.8;
          data[4] = 0.8;
          data[5] = 0.8;
          glu::CallLogWrapper::glGenBuffers
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,1,
                     (GLuint *)((long)&(this->super_ComputeShaderBase).pixelFormat + 4));
          glu::CallLogWrapper::glBindBuffer
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x8892,
                     *(GLuint *)((long)&(this->super_ComputeShaderBase).pixelFormat + 4));
          glu::CallLogWrapper::glBufferData
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x8892,0x20,&i,0x88e4);
          glu::CallLogWrapper::glBindBuffer
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x8892,0);
          glu::CallLogWrapper::glGenVertexArrays
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,1,(GLuint *)&(this->super_ComputeShaderBase).pixelFormat)
          ;
          glu::CallLogWrapper::glBindVertexArray
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,*(GLuint *)&(this->super_ComputeShaderBase).pixelFormat);
          glu::CallLogWrapper::glBindBuffer
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x8892,
                     *(GLuint *)((long)&(this->super_ComputeShaderBase).pixelFormat + 4));
          glu::CallLogWrapper::glVertexAttribPointer
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0,2,0x1406,'\0',0,(void *)0x0);
          glu::CallLogWrapper::glBindBuffer
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x8892,0);
          glu::CallLogWrapper::glEnableVertexAttribArray
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0);
          glu::CallLogWrapper::glBindVertexArray
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0);
          glu::CallLogWrapper::glClear
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x4000);
          glu::CallLogWrapper::glUseProgram
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,*(GLuint *)&(this->super_ComputeShaderBase).renderTarget)
          ;
          glu::CallLogWrapper::glBindVertexArray
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,*(GLuint *)&(this->super_ComputeShaderBase).pixelFormat);
          glu::CallLogWrapper::glDrawArrays
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0,0,4);
          glu::CallLogWrapper::glMemoryBarrier
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x200);
          glu::CallLogWrapper::glGetBufferSubData
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x90d2,0,4,&local_15c);
          if (local_15c == 0x14) {
            glu::CallLogWrapper::glGetBufferSubData
                      (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,0x90d2,0x40,4,&local_160);
            if (local_160 == 0x14) {
              this_local = (BasicAtomicCase3_conflict *)0x0;
            }
            else {
              anon_unknown_0::Output("Data at offset 0 is %d should be %d.\n",(ulong)local_160,0x14)
              ;
              this_local = (BasicAtomicCase3_conflict *)&DAT_ffffffffffffffff;
            }
          }
          else {
            anon_unknown_0::Output("Data at offset 0 is %d should be %d.\n",(ulong)local_15c,0x14);
            this_local = (BasicAtomicCase3_conflict *)&DAT_ffffffffffffffff;
          }
        }
      }
      else {
        this_local = (BasicAtomicCase3_conflict *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (BasicAtomicCase3_conflict *)0x10;
    }
  }
  else {
    this_local = (BasicAtomicCase3_conflict *)0x10;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(1))
			return NOT_SUPPORTED;
		if (!SupportedInGS(1))
			return NOT_SUPPORTED;

		const char* const glsl_vs =
			NL "layout(location = 0) in vec4 g_in_position;" NL "layout(std430, binding = 0) buffer Buffer {" NL
			   "  uvec4 u[4];" NL "  ivec3 i[4];" NL "} g_vs_buffer;" NL "void main() {" NL
			   "  gl_Position = g_in_position;" NL "  atomicAdd(g_vs_buffer.u[0].x, g_vs_buffer.u[gl_VertexID][1]);" NL
			   "  atomicAdd(g_vs_buffer.u[0][0], g_vs_buffer.u[gl_VertexID].z);" NL
			   "  atomicAdd(g_vs_buffer.i[0].x, g_vs_buffer.i[gl_VertexID][1]);" NL
			   "  atomicAdd(g_vs_buffer.i[0][0], g_vs_buffer.i[gl_VertexID].z);" NL "}";

		const char* const glsl_gs = NL
			"layout(points) in;" NL "layout(points, max_vertices = 1) out;" NL
			"layout(std430, binding = 0) buffer Buffer {" NL "  uvec4 u[4];" NL "  ivec3 i[4];" NL "} g_gs_buffer;" NL
			"void main() {" NL "  gl_Position = gl_in[0].gl_Position;" NL "  gl_PrimitiveID = gl_PrimitiveIDIn;" NL
			"  EmitVertex();" NL "  atomicAdd(g_gs_buffer.u[0].x, g_gs_buffer.u[gl_PrimitiveIDIn][1]);" NL
			"  atomicAdd(g_gs_buffer.i[0].x, g_gs_buffer.i[gl_PrimitiveIDIn][1]);" NL "}";

		const char* const glsl_fs = NL
			"layout(location = 0) out vec4 g_fs_out;" NL "layout(std430, binding = 0) buffer Buffer {" NL
			"  uvec4 u[4];" NL "  ivec3 i[4];" NL "} g_fs_buffer;" NL "void main() {" NL
			"  g_fs_out = vec4(0, 1, 0, 1);" NL "  atomicAdd(g_fs_buffer.u[0].x, g_fs_buffer.u[gl_PrimitiveID][1]);" NL
			"  atomicAdd(g_fs_buffer.i[0].x, g_fs_buffer.i[gl_PrimitiveID][1]);" NL "}";

		m_program = CreateProgram(glsl_vs, "", "", glsl_gs, glsl_fs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		/* init storage buffer */
		{
			glGenBuffers(1, &m_storage_buffer);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
			glBufferData(GL_SHADER_STORAGE_BUFFER, 8 * sizeof(int) * 4, NULL, GL_DYNAMIC_DRAW);
			ivec4* ptr = reinterpret_cast<ivec4*>(glMapBuffer(GL_SHADER_STORAGE_BUFFER, GL_WRITE_ONLY));
			if (!ptr)
				return ERROR;
			for (int i = 0; i < 4; ++i)
			{
				ptr[i * 2]	 = ivec4(0, 1, 2, 0);
				ptr[i * 2 + 1] = ivec4(0, 1, 2, 0);
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}

		/* init vertex buffer */
		{
			const float data[] = { -0.8f, -0.8f, 0.8f, -0.8f, -0.8f, 0.8f, 0.8f, 0.8f };
			glGenBuffers(1, &m_vertex_buffer);
			glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
			glBufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);
		glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
		glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, 0);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glBindVertexArray(0);

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);
		glDrawArrays(GL_POINTS, 0, 4);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		GLuint u;
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, 4, &u);
		if (u != 20)
		{
			Output("Data at offset 0 is %d should be %d.\n", u, 20);
			return ERROR;
		}
		GLint i;
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 4 * sizeof(GLuint) * 4, 4, &i);
		if (i != 20)
		{
			Output("Data at offset 0 is %d should be %d.\n", i, 20);
			return ERROR;
		}

		return NO_ERROR;
	}